

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O3

void __thiscall
flatbuffers::SymbolTable<flatbuffers::Type>::~SymbolTable(SymbolTable<flatbuffers::Type> *this)

{
  pointer ppTVar1;
  
  ppTVar1 = (this->vec).
            super__Vector_base<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar1 !=
      (this->vec).super__Vector_base<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    do {
      operator_delete(*ppTVar1,0x20);
      ppTVar1 = ppTVar1 + 1;
    } while (ppTVar1 !=
             (this->vec).
             super__Vector_base<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
    ppTVar1 = (this->vec).
              super__Vector_base<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1,(long)(this->vec).
                                  super__Vector_base<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppTVar1
                   );
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>_>_>
               *)this);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }